

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  int oldInputNr;
  xmlParserCtxtPtr ctxt_local;
  
  if (*ctxt->input->cur == '[') {
    iVar1 = ctxt->inputNr;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
LAB_0014c1d0:
    if ((*ctxt->input->cur != ']') || (bVar2 = false, iVar1 < ctxt->inputNr)) {
      bVar2 = ctxt->disableSAX < 2;
    }
    if (!bVar2) goto LAB_0014c382;
    if ((((ctxt->inSubset == 2) ||
         ((ctxt->input->entity != (xmlEntityPtr)0x0 &&
          (ctxt->input->entity->etype == XML_EXTERNAL_PARAMETER_ENTITY)))) &&
        (*ctxt->input->cur == '<')) &&
       ((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '[')))) {
      xmlParseConditionalSections(ctxt);
    }
    else if ((*ctxt->input->cur == '<') &&
            ((ctxt->input->cur[1] == '!' || (ctxt->input->cur[1] == '?')))) {
      xmlParseMarkupDecl(ctxt);
    }
    else {
      if (*ctxt->input->cur != '%') goto LAB_0014c2ff;
      xmlParsePEReference(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40U) == 0) {
      xmlParserShrink(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    goto LAB_0014c1d0;
  }
LAB_0014c3c1:
  if ((ctxt->wellFormed == 0) || (*ctxt->input->cur == '>')) {
    xmlNextChar(ctxt);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
  }
  return;
LAB_0014c2ff:
  xmlFatalErr(ctxt,XML_ERR_INT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_0014c382:
  while (iVar1 < ctxt->inputNr) {
    xmlPopPE(ctxt);
  }
  if (*ctxt->input->cur == ']') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
  }
  goto LAB_0014c3c1;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {
    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int oldInputNr = ctxt->inputNr;

        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	SKIP_BLANKS;
	while (((RAW != ']') || (ctxt->inputNr > oldInputNr)) &&
               (PARSER_STOPPED(ctxt) == 0)) {

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((PARSER_EXTERNAL(ctxt)) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
	        xmlParseMarkupDecl(ctxt);
            } else if (RAW == '%') {
	        xmlParsePEReference(ctxt);
            } else {
		xmlFatalErr(ctxt, XML_ERR_INT_SUBSET_NOT_FINISHED, NULL);
                break;
            }
	    SKIP_BLANKS_PE;
            SHRINK;
            GROW;
	}

        while (ctxt->inputNr > oldInputNr)
            xmlPopPE(ctxt);

	if (RAW == ']') {
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if ((ctxt->wellFormed) && (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	return;
    }
    NEXT;
}